

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

bool __thiscall LiteScript::Class::operator!=(Class *this,Class *c)

{
  bool bVar1;
  ulong uVar2;
  Object *pOVar3;
  Type *this_00;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  uVar2 = (ulong)((long)(this->inherit).
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->inherit).
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  bVar6 = (int)uVar2 == 0;
  if (!bVar6) {
    uVar2 = uVar2 & 0xffffffff;
    lVar5 = 0;
    uVar4 = 1;
    do {
      pOVar3 = Variable::operator->
                         ((Variable *)
                          ((long)&((this->inherit).
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->obj + lVar5));
      this_00 = Object::GetType(pOVar3);
      bVar1 = Type::operator==(this_00,(Type *)_type_class);
      if ((bVar1) &&
         (pOVar3 = Variable::operator->
                             ((Variable *)
                              ((long)&((this->inherit).
                                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->obj + lVar5)),
         (Class *)pOVar3->data == this)) {
        return bVar6;
      }
      bVar6 = uVar2 <= uVar4;
      lVar5 = lVar5 + 0x10;
      bVar1 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar1);
  }
  return bVar6;
}

Assistant:

const char * LiteScript::Namespace::GetKey(unsigned int idx) const {
    if (idx < this->vars.size())
        return this->vars[idx].first.c_str();
    else
        return nullptr;
}